

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_indices(xr_ogf_v4 *this,xr_reader *r)

{
  uint32_t uVar1;
  ulong n_00;
  size_t n;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  uVar1 = xr_reader::r_u32(r);
  n_00 = (ulong)uVar1;
  if (n_00 == 0 || n_00 % 3 != 0) {
    __assert_fail("n && (n % 3) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                  ,0x91,"void xray_re::xr_ogf_v4::load_indices(xr_reader &)");
  }
  xr_ibuf::load(&(this->super_xr_ogf).m_ib,r,n_00);
  xr_reader::debug_find_chunk(r);
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,4);
  return;
}

Assistant:

inline void xr_ogf_v4::load_indices(xr_reader& r)
{
	size_t n = r.r_u32();
	xr_assert(n && (n % 3) == 0);
	m_ib.load(r, n);
	r.debug_find_chunk();
	set_chunk_loaded(OGF4_INDICES);
}